

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

string * __thiscall
lest::make_tuple_string<std::tuple<char,int,double,char_const*>,2ul>::make_abi_cxx11_
          (string *__return_storage_ptr__,
          make_tuple_string<std::tuple<char,int,double,char_const*>,2ul> *this,
          tuple<char,_int,_double,_const_char_*> *tuple)

{
  ostream *poVar1;
  tuple<char,_int,_double,_const_char_*> *tuple_00;
  ostringstream os;
  string asStackY_1c8 [4];
  int in_stack_fffffffffffffe3c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  ostringstream local_188 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  to_string_abi_cxx11_(in_stack_fffffffffffffe3c);
  poVar1 = std::operator<<((ostream *)local_188,asStackY_1c8);
  std::operator<<(poVar1,", ");
  std::__cxx11::string::~string(asStackY_1c8);
  make_tuple_string<std::tuple<char,int,double,char_const*>,1ul>::make_abi_cxx11_
            ((string *)asStackY_1c8,
             (make_tuple_string<std::tuple<char,int,double,char_const*>,1ul> *)this,tuple_00);
  std::__cxx11::stringbuf::str();
  std::operator+(__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)asStackY_1c8,
                 &local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string(asStackY_1c8);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return __return_storage_ptr__;
}

Assistant:

static std::string make( TU const & tuple )
    {
        std::ostringstream os;
        os << to_string( std::get<N - 1>( tuple ) ) << ( N < std::tuple_size<TU>::value ? ", ": " ");
        return make_tuple_string<TU, N - 1>::make( tuple ) + os.str();
    }